

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O2

vrna_exp_param_t * copy_pf_param(void)

{
  vrna_exp_param_t *pvVar1;
  void *__dest;
  vrna_md_t md;
  vrna_md_t local_7f0;
  
  if (pf.id != -1) {
    set_model_details(&local_7f0);
    pvVar1 = vrna_exp_params(&local_7f0);
    pvVar1->pf_scale = pf_scale;
    return pvVar1;
  }
  __dest = vrna_alloc(0x66760);
  pvVar1 = (vrna_exp_param_t *)memcpy(__dest,&pf,0x66760);
  return pvVar1;
}

Assistant:

PUBLIC vrna_exp_param_t *
copy_pf_param(void)
{
  vrna_exp_param_t *copy;

  if (pf.id != pf_id) {
    vrna_md_t md;
    set_model_details(&md);
    copy            = vrna_exp_params(&md);
    copy->pf_scale  = pf_scale;
    return copy;
  } else {
    copy = (vrna_exp_param_t *)vrna_alloc(sizeof(vrna_exp_param_t));
    memcpy(copy, &pf, sizeof(vrna_exp_param_t));
  }

  return copy;
}